

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O0

KFLOAT32 * __thiscall KDIS::DATA_TYPE::EulerAngles::operator[](EulerAngles *this,KUINT16 i)

{
  KException *this_00;
  allocator<char> local_41;
  KString local_40;
  KUINT16 local_1a;
  EulerAngles *pEStack_18;
  KUINT16 i_local;
  EulerAngles *this_local;
  
  if (i == 0) {
    this_local = (EulerAngles *)&this->m_f32Psi;
  }
  else if (i == 1) {
    this_local = (EulerAngles *)&this->m_f32Theta;
  }
  else {
    if (i != 2) {
      local_1a = i;
      pEStack_18 = this;
      this_00 = (KException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"operator[]",&local_41)
      ;
      KException::KException(this_00,&local_40,7);
      __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
    }
    this_local = (EulerAngles *)&this->m_f32Phi;
  }
  return (KFLOAT32 *)this_local;
}

Assistant:

const KFLOAT32 &EulerAngles::operator[](KUINT16 i) const noexcept(false)
{
    switch( i )
    {
    case 0:
        return m_f32Psi;
    case 1:
        return m_f32Theta;
    case 2:
        return m_f32Phi;
    default:
        throw KException( __FUNCTION__, OUT_OF_BOUNDS );
    }
}